

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ListColumnReader::ReadInternal<duckdb::TemplatedListReader>
          (ListColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          optional_ptr<duckdb::Vector,_true> result_out)

{
  Vector *this_00;
  ParquetColumnSchema *pPVar1;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *this_01;
  int iVar2;
  idx_t repdef_idx;
  pointer pCVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  idx_t iVar4;
  ulong uVar5;
  ulong offset;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  DATA data;
  DATA local_50;
  VectorCache *local_40;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *local_38;
  
  local_50 = TemplatedListReader::Initialize((optional_ptr<duckdb::Vector,_true>)0xdbf2bf);
  local_38 = &this->child_column_reader;
  this_00 = &this->read_vector;
  local_40 = &this->read_cache;
  bVar8 = false;
  offset = 0;
  do {
    if (bVar8) {
      return offset;
    }
    uVar5 = this->overflow_child_count;
    if (uVar5 == 0) {
      switchD_0049f7f1::default
                ((this->child_defines).super_ByteBuffer.ptr,0,
                 (this->child_defines).super_ByteBuffer.len);
      switchD_0049f7f1::default
                ((this->child_repeats).super_ByteBuffer.ptr,0,
                 (this->child_repeats).super_ByteBuffer.len);
      this_01 = local_38;
      pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(local_38);
      iVar2 = (*pCVar3->_vptr_ColumnReader[9])(pCVar3);
      uVar5 = CONCAT44(extraout_var,iVar2);
      if (0x7ff < uVar5) {
        uVar5 = 0x800;
      }
      Vector::ResetFromCache(this_00,local_40);
      pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(this_01);
      iVar2 = (*pCVar3->_vptr_ColumnReader[3])
                        (pCVar3,uVar5,this->child_defines_ptr,this->child_repeats_ptr,this_00);
      uVar5 = CONCAT44(extraout_var_00,iVar2);
      if (uVar5 == 0) {
        return offset;
      }
    }
    else {
      this->overflow_child_count = 0;
    }
    Vector::Verify(this_00,uVar5);
    iVar4 = TemplatedListReader::GetOffset((optional_ptr<duckdb::Vector,_true>)0xdbf3be);
    for (uVar6 = 0; bVar8 = uVar5 != uVar6, uVar7 = uVar5, bVar8; uVar6 = uVar6 + 1) {
      pPVar1 = (this->super_ColumnReader).column_schema;
      if (pPVar1->max_repeat == (ulong)this->child_repeats_ptr[uVar6]) {
        local_50.result_ptr[offset - 1].length = local_50.result_ptr[offset - 1].length + 1;
      }
      else {
        uVar7 = uVar6;
        if (num_values <= offset) break;
        uVar7 = pPVar1->max_define;
        if (this->child_defines_ptr[uVar6] < uVar7) {
          if (uVar7 - 1 == (ulong)this->child_defines_ptr[uVar6]) {
            local_50.result_ptr[offset].offset = iVar4 + uVar6;
            local_50.result_ptr[offset].length = 0;
          }
          else {
            TemplatedListReader::HandleNull(&local_50,offset);
          }
        }
        else {
          local_50.result_ptr[offset].offset = iVar4 + uVar6;
          local_50.result_ptr[offset].length = 1;
        }
        if (repeat_out != (data_ptr_t)0x0) {
          repeat_out[offset] = this->child_repeats_ptr[uVar6];
        }
        if (define_out != (data_ptr_t)0x0) {
          define_out[offset] = this->child_defines_ptr[uVar6];
        }
        offset = offset + 1;
      }
    }
    TemplatedListReader::AppendVector(result_out,this_00,uVar7);
    if (offset == num_values && uVar6 < uVar5) {
      Vector::Slice(this_00,this_00,uVar7,uVar5);
      this->overflow_child_count = uVar5 - uVar7;
      Vector::Verify(this_00,uVar5 - uVar7);
      for (uVar5 = 0; uVar5 < this->overflow_child_count; uVar5 = uVar5 + 1) {
        this->child_defines_ptr[uVar5] = this->child_defines_ptr[uVar7];
        this->child_repeats_ptr[uVar5] = this->child_repeats_ptr[uVar7];
        uVar7 = uVar7 + 1;
      }
    }
  } while( true );
}

Assistant:

idx_t ListColumnReader::ReadInternal(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out,
                                     optional_ptr<Vector> result_out) {
	idx_t result_offset = 0;
	auto data = OP::Initialize(result_out);

	// if an individual list is longer than STANDARD_VECTOR_SIZE we actually have to loop the child read to fill it
	bool finished = false;
	while (!finished) {
		idx_t child_actual_num_values = 0;

		// check if we have any overflow from a previous read
		if (overflow_child_count == 0) {
			// we don't: read elements from the child reader
			child_defines.zero();
			child_repeats.zero();
			// we don't know in advance how many values to read because of the beautiful repetition/definition setup
			// we just read (up to) a vector from the child column, and see if we have read enough
			// if we have not read enough, we read another vector
			// if we have read enough, we leave any unhandled elements in the overflow vector for a subsequent read
			auto child_req_num_values =
			    MinValue<idx_t>(STANDARD_VECTOR_SIZE, child_column_reader->GroupRowsAvailable());
			read_vector.ResetFromCache(read_cache);
			child_actual_num_values =
			    child_column_reader->Read(child_req_num_values, child_defines_ptr, child_repeats_ptr, read_vector);
		} else {
			// we do: use the overflow values
			child_actual_num_values = overflow_child_count;
			overflow_child_count = 0;
		}

		if (child_actual_num_values == 0) {
			// no more elements available: we are done
			break;
		}
		read_vector.Verify(child_actual_num_values);
		idx_t current_chunk_offset = OP::GetOffset(result_out);

		// hard-won piece of code this, modify at your own risk
		// the intuition is that we have to only collapse values into lists that are repeated *on this level*
		// the rest is pretty much handed up as-is as a single-valued list or NULL
		idx_t child_idx;
		for (child_idx = 0; child_idx < child_actual_num_values; child_idx++) {
			if (child_repeats_ptr[child_idx] == MaxRepeat()) {
				// value repeats on this level, append
				D_ASSERT(result_offset > 0);
				OP::HandleRepeat(data, result_offset - 1);
				continue;
			}

			if (result_offset >= num_values) {
				// we ran out of output space
				finished = true;
				break;
			}
			if (child_defines_ptr[child_idx] >= MaxDefine()) {
				// value has been defined down the stack, hence its NOT NULL
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 1);
			} else if (child_defines_ptr[child_idx] == MaxDefine() - 1) {
				// empty list
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 0);
			} else {
				// value is NULL somewhere up the stack
				OP::HandleNull(data, result_offset);
			}

			if (repeat_out) {
				repeat_out[result_offset] = child_repeats_ptr[child_idx];
			}
			if (define_out) {
				define_out[result_offset] = child_defines_ptr[child_idx];
			}

			result_offset++;
		}
		// actually append the required elements to the child list
		OP::AppendVector(result_out, read_vector, child_idx);

		// we have read more values from the child reader than we can fit into the result for this read
		// we have to pass everything from child_idx to child_actual_num_values into the next call
		if (child_idx < child_actual_num_values && result_offset == num_values) {
			read_vector.Slice(read_vector, child_idx, child_actual_num_values);
			overflow_child_count = child_actual_num_values - child_idx;
			read_vector.Verify(overflow_child_count);

			// move values in the child repeats and defines *backward* by child_idx
			for (idx_t repdef_idx = 0; repdef_idx < overflow_child_count; repdef_idx++) {
				child_defines_ptr[repdef_idx] = child_defines_ptr[child_idx + repdef_idx];
				child_repeats_ptr[repdef_idx] = child_repeats_ptr[child_idx + repdef_idx];
			}
		}
	}
	return result_offset;
}